

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_test.cc
# Opt level: O1

void __thiscall leveldb::FileNameTest_Parse_Test::TestBody(FileNameTest_Parse_Test *this)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  uint64_t *lhs;
  char *pcVar4;
  char *in_R9;
  long lVar5;
  AssertionResult gtest_ar_;
  string f;
  FileType type;
  AssertionResult gtest_ar;
  uint64_t number;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  Message local_98;
  undefined8 *local_90;
  string local_88;
  FileType local_64;
  string local_60;
  uint64_t local_40;
  AssertHelper local_38;
  
  lhs = &TestBody::cases[0].number;
  lVar5 = 0xb;
  while( true ) {
    std::__cxx11::string::string
              ((string *)&local_88,((anon_struct_24_3_c50df6cb *)(lhs + -1))->fname,
               (allocator *)&local_60);
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)ParseFileName(&local_88,&local_40,&local_64);
    local_90 = (undefined8 *)0x0;
    if (!(bool)local_98.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10),local_88._M_dataplus._M_p,
                 local_88._M_string_length);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&local_98,(AssertionResult *)0x1331c9,"false","true",in_R9);
      pcVar4 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
      iVar3 = 0x27;
      goto LAB_001088a6;
    }
    testing::internal::CmpHelperEQ<leveldb::FileType,leveldb::FileType>
              ((internal *)&local_60,"cases[i].type","type",(FileType *)(lhs + 1),&local_64);
    sVar1 = local_60._M_string_length;
    if ((char)local_60._M_dataplus._M_p == '\0') break;
    if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_60._M_string_length !=
          (undefined8 *)(local_60._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_60._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_60,"cases[i].number","number",lhs,&local_40);
    sVar1 = local_60._M_string_length;
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT71(local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) + 0x10),local_88._M_dataplus._M_p,
                 local_88._M_string_length);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_60._M_string_length;
      }
      iVar3 = 0x29;
      goto LAB_00108929;
    }
    if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_60._M_string_length !=
          (undefined8 *)(local_60._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_60._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    lhs = lhs + 3;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      lVar5 = 0;
      while( true ) {
        std::__cxx11::string::string
                  ((string *)&local_88,
                   (char *)((long)&_ZZN7leveldb23FileNameTest_Parse_Test8TestBodyEvE6errors_rel +
                           (long)*(int *)((long)&
                                                _ZZN7leveldb23FileNameTest_Parse_Test8TestBodyEvE6errors_rel
                                         + lVar5)),(allocator *)&local_60);
        bVar2 = ParseFileName(&local_88,&local_40,&local_64);
        local_98.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)!bVar2;
        local_90 = (undefined8 *)0x0;
        if (!(bool)local_98.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        lVar5 = lVar5 + 4;
        if (lVar5 == 0x58) {
          return;
        }
      }
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10),local_88._M_dataplus._M_p,
                 local_88._M_string_length);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&local_98,
                 (AssertionResult *)"!ParseFileName(f, &number, &type)","false","true",in_R9);
      pcVar4 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
      iVar3 = 0x45;
LAB_001088a6:
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/filename_test.cc"
                 ,iVar3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
      }
      local_60._M_string_length = (size_type)local_90;
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        local_60._M_string_length = (size_type)local_90;
      }
LAB_00108959:
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_60._M_string_length !=
            (undefined8 *)(local_60._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_60._M_string_length);
        }
        operator_delete((void *)local_60._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      return;
    }
  }
  testing::Message::Message(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (CONCAT71(local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) + 0x10),local_88._M_dataplus._M_p,
             local_88._M_string_length);
  if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)local_60._M_string_length;
  }
  iVar3 = 0x28;
LAB_00108929:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/filename_test.cc"
             ,iVar3,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,&local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
  if ((long *)CONCAT71(local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_98.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_98.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_98.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  goto LAB_00108959;
}

Assistant:

TEST(FileNameTest, Parse) {
  Slice db;
  FileType type;
  uint64_t number;

  // Successful parses
  static struct {
    const char* fname;
    uint64_t number;
    FileType type;
  } cases[] = {
      {"100.log", 100, kLogFile},
      {"0.log", 0, kLogFile},
      {"0.sst", 0, kTableFile},
      {"0.ldb", 0, kTableFile},
      {"CURRENT", 0, kCurrentFile},
      {"LOCK", 0, kDBLockFile},
      {"MANIFEST-2", 2, kDescriptorFile},
      {"MANIFEST-7", 7, kDescriptorFile},
      {"LOG", 0, kInfoLogFile},
      {"LOG.old", 0, kInfoLogFile},
      {"18446744073709551615.log", 18446744073709551615ull, kLogFile},
  };
  for (int i = 0; i < sizeof(cases) / sizeof(cases[0]); i++) {
    std::string f = cases[i].fname;
    ASSERT_TRUE(ParseFileName(f, &number, &type)) << f;
    ASSERT_EQ(cases[i].type, type) << f;
    ASSERT_EQ(cases[i].number, number) << f;
  }

  // Errors
  static const char* errors[] = {"",
                                 "foo",
                                 "foo-dx-100.log",
                                 ".log",
                                 "",
                                 "manifest",
                                 "CURREN",
                                 "CURRENTX",
                                 "MANIFES",
                                 "MANIFEST",
                                 "MANIFEST-",
                                 "XMANIFEST-3",
                                 "MANIFEST-3x",
                                 "LOC",
                                 "LOCKx",
                                 "LO",
                                 "LOGx",
                                 "18446744073709551616.log",
                                 "184467440737095516150.log",
                                 "100",
                                 "100.",
                                 "100.lop"};
  for (int i = 0; i < sizeof(errors) / sizeof(errors[0]); i++) {
    std::string f = errors[i];
    ASSERT_TRUE(!ParseFileName(f, &number, &type)) << f;
  }
}